

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

string * __thiscall pbrt::SPPMIntegrator::ToString_abi_cxx11_(SPPMIntegrator *this)

{
  string *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  float *in_stack_00000010;
  CameraHandle *in_stack_00000018;
  char *in_stack_00000020;
  int *in_stack_00000040;
  bool *in_stack_00000048;
  RGBColorSpace *in_stack_00000050;
  
  StringPrintf<pbrt::CameraHandle_const&,float_const&,int_const&,int_const&,int_const&,bool_const&,pbrt::RGBColorSpace_const&>
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             in_stack_00000040,in_stack_00000048,in_stack_00000050);
  return in_RDI;
}

Assistant:

std::string SPPMIntegrator::ToString() const {
    return StringPrintf("[ SPPMIntegrator camera: %s initialSearchRadius: %f "
                        "nIterations: %d maxDepth: %d photonsPerIteration: %d "
                        "regularize: %s colorSpace: %s digitPermutations:(elided) ]",
                        camera, initialSearchRadius, nIterations, maxDepth,
                        photonsPerIteration, regularize, *colorSpace);
}